

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  int iVar1;
  curl_trc_feat *pcVar2;
  sockaddr *psVar3;
  undefined8 uVar4;
  DOHcode DVar5;
  int iVar6;
  uchar *puVar7;
  size_t dohlen;
  ulong uVar8;
  size_t sVar9;
  Curl_addrinfo *pCVar10;
  Curl_dns_entry *pCVar11;
  uint uVar12;
  char *pcVar13;
  Curl_addrinfo *pCVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  CURLcode CVar18;
  long lVar19;
  anon_union_16_2_f9ece763_for_ip *paVar20;
  doh_probes *pdVar21;
  CURLcode CVar22;
  uint uVar23;
  ushort uVar24;
  uint uVar25;
  uint uVar26;
  Curl_addrinfo *pCVar27;
  long lVar28;
  dohentry *pdVar29;
  Curl_addrinfo *addr;
  bool bVar30;
  DOHcode rc [2];
  dohentry de;
  uint local_304;
  undefined8 local_300;
  uint local_2f4;
  uchar *local_2f0;
  CURLcode local_2e4;
  char *local_2e0;
  doh_probes *local_2d8;
  Curl_addrinfo *local_2d0;
  long local_2c8;
  Curl_easy *local_2c0;
  undefined8 local_2b8;
  Curl_dns_entry **local_2b0;
  size_t local_2a8;
  dohentry local_2a0;
  
  local_2d8 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (local_2d8 == (doh_probes *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((local_2d8->probe[0].easy_mid < 0) && (local_2d8->probe[1].easy_mid < 0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    return (((ulong)data->conn->bits & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if (local_2d8->pending != 0) {
    return CURLE_OK;
  }
  pCVar14 = (Curl_addrinfo *)local_2d8->probe;
  local_2b8 = 0;
  local_2b0 = dnsp;
  Curl_doh_close(data);
  lVar19 = 0;
  memset(&local_2a0,0,0x270);
  local_2a0.ttl = 0x7fffffff;
  do {
    Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar19),0x100);
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x80);
  pCVar10 = (Curl_addrinfo *)0x0;
  local_2d0 = pCVar14;
  local_2c0 = data;
LAB_00123e40:
  lVar19 = (long)pCVar10 * 0x238;
  pCVar27 = pCVar14;
  if (*(int *)((long)pCVar14 + lVar19 + 8) != 0) {
    s = (dynbuf *)((long)pCVar14 + lVar19 + 0x218);
    puVar7 = Curl_dyn_uptr(s);
    dohlen = Curl_dyn_len(s);
    local_304 = 0xc;
    DVar5 = DOH_TOO_SMALL_BUFFER;
    uVar16 = local_304;
    if ((((0xb < dohlen) && (DVar5 = DOH_DNS_BAD_ID, puVar7 != (uchar *)0x0)) && (*puVar7 == '\0'))
       && ((puVar7[1] == '\0' && (DVar5 = DOH_DNS_BAD_RCODE, (puVar7[3] & 0xf) == 0)))) {
      local_2f4 = *(uint *)((long)pCVar14 + lVar19 + 8);
      local_2f0 = puVar7;
      for (uVar24 = *(ushort *)(puVar7 + 4) << 8 | *(ushort *)(puVar7 + 4) >> 8; uVar24 != 0;
          uVar24 = uVar24 - 1) {
        DVar5 = doh_skipqname(local_2f0,dohlen,&local_304);
        uVar16 = local_304;
        if (DVar5 != DOH_OK) goto LAB_00123eb9;
        if (dohlen < local_304 + 4) {
          DVar5 = DOH_DNS_OUT_OF_RANGE;
          goto LAB_00123eb9;
        }
        local_304 = local_304 + 4;
      }
      local_300._4_4_ = (undefined4)((ulong)local_300 >> 0x20);
      local_300 = (Curl_addrinfo *)
                  CONCAT44(local_300._4_4_,
                           (uint)(ushort)(*(ushort *)(local_2f0 + 6) << 8 |
                                         *(ushort *)(local_2f0 + 6) >> 8));
      uVar25 = 0;
      do {
        if ((short)local_300 == 0) {
          uVar24 = *(ushort *)(local_2f0 + 8) << 8 | *(ushort *)(local_2f0 + 8) >> 8;
          goto joined_r0x0012413e;
        }
        DVar5 = doh_skipqname(local_2f0,dohlen,&local_304);
        if (DVar5 == DOH_OK) {
          uVar8 = (ulong)local_304;
          uVar12 = local_304 + 2;
          DVar5 = DOH_DNS_OUT_OF_RANGE;
          uVar16 = local_304;
          if (uVar12 <= dohlen) {
            uVar23 = local_304 + 1;
            uVar25 = (uint)CONCAT11(local_2f0[uVar8],local_2f0[uVar23]);
            if (((uVar25 == 5) || (uVar25 == 0x27)) || (local_2f4 == uVar25)) {
              uVar15 = local_304 + 4;
              uVar16 = uVar12;
              if (uVar15 <= dohlen) {
                if (CONCAT11(local_2f0[uVar12],local_2f0[local_304 + 3]) == 1) {
                  uVar12 = local_304 + 8;
                  uVar16 = uVar15;
                  if (uVar12 <= dohlen) {
                    uVar16 = *(uint *)(local_2f0 + uVar15);
                    uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                             uVar16 << 0x18;
                    if (uVar16 < local_2a0.ttl) {
                      local_2a0.ttl = uVar16;
                    }
                    uVar15 = local_304 + 10;
                    uVar16 = uVar12;
                    if (uVar15 <= dohlen) {
                      local_2e0 = (char *)CONCAT44(local_2e0._4_4_,uVar25);
                      uVar16 = local_304 + 9;
                      uVar26 = uVar15 + CONCAT11(local_2f0[uVar12],local_2f0[uVar16]);
                      local_304 = uVar15;
                      if (dohlen < uVar26) {
                        bVar30 = false;
                      }
                      else {
                        DVar5 = doh_rdata(local_2f0,dohlen,
                                          CONCAT11(local_2f0[uVar12],local_2f0[uVar16]),
                                          CONCAT11(local_2f0[uVar8],local_2f0[uVar23]),uVar15,
                                          &local_2a0);
                        bVar30 = DVar5 == DOH_OK;
                        if (bVar30) {
                          local_300 = (Curl_addrinfo *)CONCAT44(local_300._4_4_,(int)local_300 + -1)
                          ;
                          DVar5 = (DOHcode)local_2c8;
                          local_304 = uVar26;
                        }
                        uVar25 = (uint)local_2e0;
                      }
                      goto LAB_001240df;
                    }
                  }
                }
                else {
                  DVar5 = DOH_DNS_UNEXPECTED_CLASS;
                }
              }
            }
            else {
              DVar5 = DOH_DNS_UNEXPECTED_TYPE;
            }
          }
          local_304 = uVar16;
          bVar30 = false;
        }
        else {
          bVar30 = false;
        }
LAB_001240df:
        local_2c8 = CONCAT44(local_2c8._4_4_,DVar5);
        uVar16 = local_304;
      } while (bVar30);
    }
    goto LAB_00123eb9;
  }
  goto LAB_00123f5d;
joined_r0x0012413e:
  if (uVar24 == 0) goto LAB_001241b8;
  local_300._2_6_ = (undefined6)((ulong)local_300 >> 0x10);
  local_300 = (Curl_addrinfo *)CONCAT62(local_300._2_6_,uVar24);
  DVar5 = doh_skipqname(local_2f0,dohlen,&local_304);
  uVar16 = local_304;
  if (DVar5 != DOH_OK) goto LAB_00123eb9;
  uVar12 = local_304 + 8;
  DVar5 = DOH_DNS_OUT_OF_RANGE;
  if (((dohlen < uVar12) || (uVar23 = local_304 + 10, uVar16 = uVar12, dohlen < uVar23)) ||
     (local_304 = CONCAT11(local_2f0[uVar12],local_2f0[local_304 + 9]) + uVar23, uVar16 = uVar23,
     dohlen < local_304)) goto LAB_00123eb9;
  uVar24 = (short)local_300 - 1;
  goto joined_r0x0012413e;
LAB_001241b8:
  uVar24 = *(ushort *)(local_2f0 + 10) << 8 | *(ushort *)(local_2f0 + 10) >> 8;
  while (uVar24 != 0) {
    local_300._2_6_ = (undefined6)((ulong)local_300 >> 0x10);
    local_300 = (Curl_addrinfo *)CONCAT62(local_300._2_6_,uVar24);
    DVar5 = doh_skipqname(local_2f0,dohlen,&local_304);
    uVar16 = local_304;
    if (DVar5 != DOH_OK) goto LAB_00123eb9;
    uVar12 = local_304 + 8;
    DVar5 = DOH_DNS_OUT_OF_RANGE;
    if (((dohlen < uVar12) || (uVar23 = local_304 + 10, uVar16 = uVar12, dohlen < uVar23)) ||
       (local_304 = CONCAT11(local_2f0[uVar12],local_2f0[local_304 + 9]) + uVar23, uVar16 = uVar23,
       dohlen < local_304)) goto LAB_00123eb9;
    uVar24 = (short)local_300 - 1;
  }
  DVar5 = DOH_DNS_MALFORMAT;
  uVar16 = local_304;
  if (dohlen == local_304) {
    DVar5 = DOH_OK;
    if (local_2a0.numaddr == 0 && local_2a0.numcname == 0) {
      DVar5 = DOH_NO_CONTENT;
    }
    if ((short)uVar25 == 2) {
      DVar5 = DOH_OK;
    }
  }
LAB_00123eb9:
  local_304 = uVar16;
  *(DOHcode *)((long)&local_2b8 + (long)pCVar10 * 4) = DVar5;
  Curl_dyn_free(s);
  data = local_2c0;
  pCVar27 = local_2d0;
  if (((local_2c0 != (Curl_easy *)0x0) && (DVar5 != DOH_OK)) &&
     ((((local_2c0->set).field_0x8cd & 0x10) != 0 &&
      ((pcVar2 = (local_2c0->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
      )))) {
    pcVar17 = "bad error code";
    if (DVar5 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) {
      pcVar17 = errors_rel + *(int *)(errors_rel + (ulong)DVar5 * 4);
    }
    iVar1 = *(int *)((long)pCVar14 + lVar19 + 8);
    pcVar13 = "unknown";
    if (iVar1 == 0x1c) {
      pcVar13 = "AAAA";
    }
    if (iVar1 == 1) {
      pcVar13 = "A";
    }
    Curl_infof(local_2c0,"DoH: %s type %s for %s",pcVar17,pcVar13,local_2d8->host);
  }
LAB_00123f5d:
  pdVar21 = local_2d8;
  addr = (Curl_addrinfo *)((long)&pCVar10->ai_flags + 1);
  bVar30 = pCVar10 != (Curl_addrinfo *)0x0;
  pCVar14 = pCVar27;
  pCVar10 = addr;
  if (bVar30) goto LAB_0012429d;
  goto LAB_00123e40;
LAB_0012429d:
  if ((int)local_2b8 != 0) {
    CVar18 = CURLE_COULDNT_RESOLVE_HOST;
    if (local_2b8._4_4_ != 0) goto LAB_001245bf;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_doh_trc.log_level)) {
    if ((pcVar2 == (curl_trc_feat *)0x0) || (0 < pcVar2->log_level)) {
      Curl_infof(data,"[DoH] hostname: %s",local_2d8->host);
    }
    doh_show(data,&local_2a0);
  }
  local_2e0 = pdVar21->host;
  local_2f4 = pdVar21->port;
  sVar9 = strlen(local_2e0);
  if (local_2a0.numaddr == 0) {
    CVar22 = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    if (local_2a0.numaddr < 1) {
      local_300 = (Curl_addrinfo *)0x0;
      local_2e4 = CURLE_OK;
    }
    else {
      local_2a8 = sVar9 + 1;
      local_2c8 = sVar9 + 0x31;
      local_2f4 = CONCAT22((short)(local_2f4 >> 0x10),
                           (ushort)local_2f4 << 8 | (ushort)local_2f4 >> 8);
      lVar19 = 0;
      paVar20 = &local_2a0.addr[0].ip;
      local_2e4 = CURLE_OK;
      pCVar14 = (Curl_addrinfo *)0x0;
      local_300 = (Curl_addrinfo *)0x0;
      do {
        iVar1 = ((dohaddr *)((long)paVar20 + -4))->type;
        lVar28 = 0x1c;
        local_2f0 = (uchar *)CONCAT71(local_2f0._1_7_,iVar1 == 0x1c);
        if (iVar1 != 0x1c) {
          lVar28 = 0x10;
        }
        local_2d0 = pCVar14;
        pCVar10 = (Curl_addrinfo *)(*Curl_ccalloc)(1,local_2c8 + lVar28);
        if (pCVar10 == (Curl_addrinfo *)0x0) {
          local_2e4 = CURLE_OUT_OF_MEMORY;
          pCVar14 = local_2d0;
        }
        else {
          pCVar10->ai_addr = (sockaddr *)(pCVar10 + 1);
          pcVar17 = (char *)((long)&pCVar10[1].ai_flags + lVar28);
          pCVar10->ai_canonname = pcVar17;
          memcpy(pcVar17,local_2e0,local_2a8);
          if (local_300 == (Curl_addrinfo *)0x0) {
            local_300 = pCVar10;
          }
          if (local_2d0 != (Curl_addrinfo *)0x0) {
            local_2d0->ai_next = pCVar10;
          }
          iVar6 = (uint)(byte)local_2f0 * 8 + 2;
          pCVar10->ai_family = iVar6;
          pCVar10->ai_socktype = DNS_TYPE_A;
          pCVar10->ai_addrlen = (curl_socklen_t)lVar28;
          psVar3 = pCVar10->ai_addr;
          if (iVar1 == 0x1c) {
            uVar4 = *(undefined8 *)((long)paVar20 + 8);
            *(undefined8 *)(psVar3->sa_data + 6) = *(undefined8 *)paVar20;
            psVar3[1].sa_family = (short)uVar4;
            psVar3[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
            psVar3[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
            psVar3[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
            psVar3[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
            psVar3[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
            psVar3[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
          }
          else {
            *(undefined4 *)(psVar3->sa_data + 2) = *(undefined4 *)paVar20;
          }
          psVar3->sa_family = (sa_family_t)iVar6;
          *(short *)psVar3->sa_data = (short)local_2f4;
          pCVar14 = pCVar10;
        }
        data = local_2c0;
        if (pCVar10 == (Curl_addrinfo *)0x0) break;
        lVar19 = lVar19 + 1;
        paVar20 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar20 + 0x14);
      } while (lVar19 < local_2a0.numaddr);
    }
    CVar22 = local_2e4;
    pdVar21 = local_2d8;
    addr = local_300;
    if (local_2e4 != CURLE_OK) {
      Curl_freeaddrinfo(local_300);
      pdVar21 = local_2d8;
      addr = (Curl_addrinfo *)0x0;
    }
  }
  pdVar29 = &local_2a0;
  if (CVar22 == CURLE_OK) {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar11 = Curl_cache_addr(data,addr,pdVar21->host,0,pdVar21->port,false);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar11 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(addr);
    }
    else {
      (data->state).async.dns = pCVar11;
      *local_2b0 = pCVar11;
    }
    CVar18 = CURLE_OK;
  }
  else {
    CVar18 = CVar22;
    if (0 < local_2a0.numcname) {
      lVar19 = 0;
      do {
        Curl_dyn_free(pdVar29->cname);
        lVar19 = lVar19 + 1;
        pdVar29 = (dohentry *)(pdVar29->cname + 1);
      } while (lVar19 < local_2a0.numcname);
    }
  }
  if (CVar22 != CURLE_OK) {
    return CVar22;
  }
LAB_001245bf:
  if (0 < local_2a0.numcname) {
    pdVar29 = &local_2a0;
    lVar19 = 0;
    do {
      Curl_dyn_free(pdVar29->cname);
      lVar19 = lVar19 + 1;
      pdVar29 = (dohentry *)(pdVar29->cname + 1);
    } while (lVar19 < local_2a0.numcname);
  }
  Curl_doh_cleanup(data);
  return CVar18;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe[DOH_SLOT_IPV4].easy_mid < 0 &&
     dohp->probe[DOH_SLOT_IPV6].easy_mid < 0) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_probe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->resp_body),
                                 Curl_dyn_len(&p->resp_body),
                                 p->dnstype, &de);
      Curl_dyn_free(&p->resp_body);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_doh_trc)) {
        infof(data, "[DoH] hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port, FALSE);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */
#ifdef USE_HTTPSRR
    if(de.numhttps_rrs > 0 && result == CURLE_OK && *dnsp) {
      struct Curl_https_rrinfo *hrr = NULL;
      result = doh_resp_decode_httpsrr(de.https_rrs->val, de.https_rrs->len,
                                       &hrr);
      if(result) {
        infof(data, "Failed to decode HTTPS RR");
        return result;
      }
      infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
      doh_print_httpsrr(data, hrr);
# endif
      (*dnsp)->hinfo = hrr;
    }
#endif

    /* All done */
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}